

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * initializer_list(dmr_C *C,expression_list **list,token *token)

{
  int iVar1;
  expression *local_28;
  expression *expr;
  token *token_local;
  expression_list **list_local;
  dmr_C *C_local;
  
  expr = (expression *)token;
  token_local = (token *)list;
  list_local = (expression_list **)C;
  while( true ) {
    expr = (expression *)single_initializer((dmr_C *)list_local,&local_28,(token *)expr);
    if (local_28 == (expression *)0x0) {
      return (token *)expr;
    }
    dmrC_add_expression((dmr_C *)list_local,(expression_list **)token_local,local_28);
    iVar1 = dmrC_match_op((token *)expr,0x2c);
    if (iVar1 == 0) break;
    expr = *(expression **)&expr->pos;
  }
  return (token *)expr;
}

Assistant:

static struct token *initializer_list(struct dmr_C *C, struct expression_list **list, struct token *token)
{
	struct expression *expr;

	for (;;) {
		token = single_initializer(C, &expr, token);
		if (!expr)
			break;
		dmrC_add_expression(C, list, expr);
		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
	}
	return token;
}